

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O3

bool Rct::writeFile(Path *path,String *data,int perm)

{
  FILE *__s;
  size_t sVar1;
  bool bVar2;
  Path parent;
  Path local_50;
  
  __s = fopen((path->super_String).mString._M_dataplus._M_p,"w");
  if (__s == (FILE *)0x0) {
    Path::parentDir(&local_50,path);
    if (local_50.super_String.mString._M_string_length == 0) {
      __s = (FILE *)0x0;
      bVar2 = false;
    }
    else {
      Path::mkdir(&local_50,(char *)0x1,0x1ed);
      __s = fopen((path->super_String).mString._M_dataplus._M_p,"w");
      bVar2 = __s != (FILE *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.super_String.mString._M_dataplus._M_p != &local_50.super_String.mString.field_2)
    {
      operator_delete(local_50.super_String.mString._M_dataplus._M_p);
    }
    if (!bVar2) {
      return false;
    }
  }
  sVar1 = fwrite((data->mString)._M_dataplus._M_p,(data->mString)._M_string_length,1,__s);
  fclose(__s);
  if ((int)sVar1 != 1) {
    unlink((path->super_String).mString._M_dataplus._M_p);
    return false;
  }
  if (-1 < perm) {
    chmod((path->super_String).mString._M_dataplus._M_p,perm);
    return true;
  }
  return true;
}

Assistant:

bool writeFile(const Path& path, const String& data, int perm)
{
    FILE* f = fopen(path.nullTerminated(), "w");
    if (!f) {
        // try to make the directory and reopen
        const Path parent = path.parentDir();
        if (parent.isEmpty())
            return false;
        Path::mkdir(parent, Path::Recursive);
        f = fopen(path.nullTerminated(), "w");
        if (!f)
            return false;
    }
    const int w = fwrite(data.data(), data.size(), 1, f);
    fclose(f);
    if (w != 1) {
        unlink(path.nullTerminated());
        return false;
    }
    if (perm >= 0)
        chmod(path.constData(), static_cast<mode_t>(perm));

    return true;
}